

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Annotation.cpp
# Opt level: O0

void __thiscall soul::Annotation::Annotation(Annotation *this,Annotation *other)

{
  bool bVar1;
  vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> local_30;
  Annotation *local_18;
  Annotation *other_local;
  Annotation *this_local;
  
  local_18 = other;
  other_local = this;
  std::
  unique_ptr<std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>,std::default_delete<std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>>>
  ::
  unique_ptr<std::default_delete<std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>>,void>
            ((unique_ptr<std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>,std::default_delete<std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>>>
              *)this);
  StringDictionary::StringDictionary(&this->dictionary,&local_18->dictionary);
  bVar1 = std::operator!=(&local_18->properties,(nullptr_t)0x0);
  if (bVar1) {
    std::
    unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    ::operator*(&local_18->properties);
    std::
    make_unique<std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>,std::vector<soul::Annotation::Property,std::allocator<soul::Annotation::Property>>&>
              (&local_30);
    std::
    unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    ::operator=(&this->properties,
                (unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                 *)&local_30);
    std::
    unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
                   *)&local_30);
  }
  return;
}

Assistant:

Annotation::Annotation (const Annotation& other)  : dictionary (other.dictionary)
{
    if (other.properties != nullptr)
        properties = std::make_unique<std::vector<Property>> (*other.properties);
}